

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsSampled.cpp
# Opt level: O2

void __thiscall
vkt::sparse::SparseShaderIntrinsicsCaseSampledBase::initPrograms
          (SparseShaderIntrinsicsCaseSampledBase *this,SourceCollections *programCollection)

{
  TextureFormat *format;
  ImageType imageType;
  deUint32 dVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  SpirVAsmSource *src;
  TextureFormat *format_00;
  TextureFormat *format_01;
  allocator<char> local_444;
  allocator<char> local_443;
  allocator<char> local_442;
  allocator<char> local_441;
  string typeImgCompVec4;
  string local_420;
  string typeImgComp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string coordString;
  string local_338 [32];
  ostringstream fs;
  string local_310 [368];
  ostringstream vs;
  
  dVar1 = getNumLayers((this->super_SparseShaderIntrinsicsCaseBase).m_imageType,
                       &(this->super_SparseShaderIntrinsicsCaseBase).m_imageSize);
  imageType = (this->super_SparseShaderIntrinsicsCaseBase).m_imageType;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs,"%local_texCoord_x",(allocator<char> *)&typeImgCompVec4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs,"%local_texCoord_xy",(allocator<char> *)&local_420);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&typeImgComp,"%local_texCoord_xyz",(allocator<char> *)&local_3d8);
  getShaderImageCoordinates(&coordString,imageType,(string *)&vs,(string *)&fs,&typeImgComp);
  std::__cxx11::string::~string((string *)&typeImgComp);
  std::__cxx11::string::~string((string *)&fs);
  std::__cxx11::string::~string((string *)&vs);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vs);
  poVar2 = std::operator<<((ostream *)&vs,"#version 440\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp vec2 vs_in_position;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 1) in  highp vec2 vs_in_texCoord;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec3 vs_out_texCoord;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"\tvec4  gl_Position;\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tgl_Position\t\t= vec4(vs_in_position, 0.0f, 1.0f);\n");
  poVar2 = std::operator<<(poVar2,"\tvs_out_texCoord = vec3(vs_in_texCoord, 0.0f);\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&typeImgComp,"vertex_shader",(allocator<char> *)&local_420);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&typeImgComp);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)&fs,&typeImgCompVec4);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)&fs);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string((string *)&typeImgCompVec4);
  std::__cxx11::string::~string((string *)&typeImgComp);
  if (1 < dVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fs);
    poVar2 = std::operator<<((ostream *)&fs,"#version 440\n");
    poVar2 = std::operator<<(poVar2,"layout(triangles) in;\n");
    poVar2 = std::operator<<(poVar2,"layout(triangle_strip, max_vertices = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar1 * 3);
    poVar2 = std::operator<<(poVar2,") out;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"in gl_PerVertex {\n");
    poVar2 = std::operator<<(poVar2,"\tvec4  gl_Position;\n");
    poVar2 = std::operator<<(poVar2,"} gl_in[];\n");
    poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
    poVar2 = std::operator<<(poVar2,"\tvec4  gl_Position;\n");
    poVar2 = std::operator<<(poVar2,"};\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp vec3 gs_in_texCoord[];\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp vec3 gs_out_texCoord;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"    for (int layerNdx = 0; layerNdx < ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar1);
    poVar2 = std::operator<<(poVar2,"; ++layerNdx)\n");
    poVar2 = std::operator<<(poVar2,"    {\n");
    poVar2 = std::operator<<(poVar2,
                             "\t\tfor (int vertexNdx = 0; vertexNdx < gl_in.length(); ++vertexNdx)\n"
                            );
    poVar2 = std::operator<<(poVar2,"\t\t{\n");
    poVar2 = std::operator<<(poVar2,"\t\t\tgl_Layer\t\t= layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"\t\t\tgl_Position\t\t= gl_in[vertexNdx].gl_Position;\n");
    poVar2 = std::operator<<(poVar2,
                             "\t\t\tgs_out_texCoord = vec3(gs_in_texCoord[vertexNdx].xy, float(layerNdx));\n"
                            );
    poVar2 = std::operator<<(poVar2,"\t\t\tEmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\t\t}\n");
    poVar2 = std::operator<<(poVar2,"\t\tEndPrimitive();\n");
    poVar2 = std::operator<<(poVar2,"    }\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&typeImgCompVec4,"geometry_shader",(allocator<char> *)&local_3d8);
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&typeImgCompVec4);
    std::__cxx11::stringbuf::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)&typeImgComp,&local_420);
    glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)&typeImgComp);
    std::__cxx11::string::~string((string *)&typeImgComp._M_string_length);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&typeImgCompVec4);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fs);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fs);
  format = &(this->super_SparseShaderIntrinsicsCaseBase).m_format;
  getImageComponentTypeName_abi_cxx11_(&typeImgComp,(sparse *)format,format_00);
  getImageComponentVec4TypeName_abi_cxx11_(&typeImgCompVec4,(sparse *)format,format_01);
  poVar2 = std::operator<<((ostream *)&fs,"OpCapability Shader\n");
  poVar2 = std::operator<<(poVar2,"OpCapability SampledCubeArray\n");
  poVar2 = std::operator<<(poVar2,"OpCapability ImageCubeArray\n");
  poVar2 = std::operator<<(poVar2,"OpCapability SparseResidency\n");
  poVar2 = std::operator<<(poVar2,"OpCapability StorageImageExtendedFormats\n");
  poVar2 = std::operator<<(poVar2,"%ext_import = OpExtInstImport \"GLSL.std.450\"\n");
  poVar2 = std::operator<<(poVar2,"OpMemoryModel Logical GLSL450\n");
  poVar2 = std::operator<<(poVar2,
                           "OpEntryPoint Fragment %func_main \"main\" %varying_texCoord %output_texel %output_residency\n"
                          );
  poVar2 = std::operator<<(poVar2,"OpExecutionMode %func_main OriginUpperLeft\n");
  poVar2 = std::operator<<(poVar2,"OpSource GLSL 440\n");
  poVar2 = std::operator<<(poVar2,"OpName %func_main \"main\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %varying_texCoord \"varying_texCoord\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %output_texel \"out_texel\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %output_residency \"out_residency\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %type_uniformblock \"LodBlock\"\n");
  poVar2 = std::operator<<(poVar2,"OpMemberName %type_uniformblock 0 \"lod\"\n");
  poVar2 = std::operator<<(poVar2,"OpMemberName %type_uniformblock 1 \"size\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %uniformblock_instance \"lodInstance\"\n");
  poVar2 = std::operator<<(poVar2,"OpName %uniformconst_image_sparse \"u_imageSparse\"\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %varying_texCoord Location 0\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %output_texel\t Location 0\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %output_residency Location 1\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate\t\t %type_uniformblock Block\n");
  poVar2 = std::operator<<(poVar2,"OpMemberDecorate %type_uniformblock 0 Offset 0\n");
  poVar2 = std::operator<<(poVar2,"OpMemberDecorate %type_uniformblock 1 Offset 8\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %uniformconst_image_sparse DescriptorSet 0\n");
  poVar2 = std::operator<<(poVar2,"OpDecorate %uniformconst_image_sparse Binding ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%type_void = OpTypeVoid\n");
  poVar2 = std::operator<<(poVar2,"%type_void_func = OpTypeFunction %type_void\n");
  poVar2 = std::operator<<(poVar2,"%type_bool\t\t\t\t\t\t\t= OpTypeBool\n");
  poVar2 = std::operator<<(poVar2,"%type_int\t\t\t\t\t\t\t= OpTypeInt 32 1\n");
  poVar2 = std::operator<<(poVar2,"%type_uint\t\t\t\t\t\t\t= OpTypeInt 32 0\n");
  poVar2 = std::operator<<(poVar2,"%type_float\t\t\t\t\t\t\t= OpTypeFloat 32\n");
  poVar2 = std::operator<<(poVar2,"%type_vec2\t\t\t\t\t\t\t= OpTypeVector %type_float 2\n");
  poVar2 = std::operator<<(poVar2,"%type_vec3\t\t\t\t\t\t\t= OpTypeVector %type_float 3\n");
  poVar2 = std::operator<<(poVar2,"%type_vec4\t\t\t\t\t\t\t= OpTypeVector %type_float 4\n");
  poVar2 = std::operator<<(poVar2,"%type_ivec4\t\t\t\t\t\t= OpTypeVector %type_int  4\n");
  poVar2 = std::operator<<(poVar2,"%type_uvec4\t\t\t\t\t\t= OpTypeVector %type_uint 4\n");
  poVar2 = std::operator<<(poVar2,
                           "%type_uniformblock\t\t\t\t\t= OpTypeStruct %type_uint %type_vec2\n");
  poVar2 = std::operator<<(poVar2,"%type_struct_int_img_comp_vec4\t= OpTypeStruct %type_int ");
  poVar2 = std::operator<<(poVar2,(string *)&typeImgCompVec4);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%type_input_vec3\t\t\t\t\t= OpTypePointer Input %type_vec3\n");
  poVar2 = std::operator<<(poVar2,"%type_input_float\t\t\t\t\t= OpTypePointer Input %type_float\n");
  poVar2 = std::operator<<(poVar2,"%type_output_img_comp_vec4\t\t\t= OpTypePointer Output ");
  poVar2 = std::operator<<(poVar2,(string *)&typeImgCompVec4);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%type_output_uint\t\t\t\t\t= OpTypePointer Output %type_uint\n");
  poVar2 = std::operator<<(poVar2,"%type_function_int\t\t\t\t\t= OpTypePointer Function %type_int\n"
                          );
  poVar2 = std::operator<<(poVar2,"%type_function_img_comp_vec4\t\t= OpTypePointer Function ");
  poVar2 = std::operator<<(poVar2,(string *)&typeImgCompVec4);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "%type_function_int_img_comp_vec4\t= OpTypePointer Function %type_struct_int_img_comp_vec4\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%type_pushconstant_uniformblock\t\t\t\t= OpTypePointer PushConstant %type_uniformblock\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%type_pushconstant_uniformblock_member_lod  = OpTypePointer PushConstant %type_uint\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%type_pushconstant_uniformblock_member_size = OpTypePointer PushConstant %type_vec2\n"
                          );
  poVar2 = std::operator<<(poVar2,"%type_image_sparse\t\t\t\t= ");
  getOpTypeImageSparse
            (&local_420,(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,format,&typeImgComp
             ,true);
  poVar2 = std::operator<<(poVar2,(string *)&local_420);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "%type_sampled_image_sparse\t\t= OpTypeSampledImage %type_image_sparse\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_sampled_image_sparse\n"
                          );
  poVar2 = std::operator<<(poVar2,"%varying_texCoord\t\t\t= OpVariable %type_input_vec3 Input\n");
  poVar2 = std::operator<<(poVar2,
                           "%output_texel\t\t\t\t= OpVariable %type_output_img_comp_vec4 Output\n");
  poVar2 = std::operator<<(poVar2,"%output_residency\t\t\t= OpVariable %type_output_uint Output\n");
  poVar2 = std::operator<<(poVar2,
                           "%uniformconst_image_sparse\t= OpVariable %type_uniformconst_image_sparse UniformConstant\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%uniformblock_instance  = OpVariable %type_pushconstant_uniformblock PushConstant\n"
                          );
  poVar2 = std::operator<<(poVar2,"%constant_uint_0\t\t\t\t= OpConstant %type_uint 0\n");
  poVar2 = std::operator<<(poVar2,"%constant_uint_1\t\t\t\t= OpConstant %type_uint 1\n");
  poVar2 = std::operator<<(poVar2,"%constant_uint_2\t\t\t\t= OpConstant %type_uint 2\n");
  poVar2 = std::operator<<(poVar2,"%constant_uint_3\t\t\t\t= OpConstant %type_uint 3\n");
  poVar2 = std::operator<<(poVar2,"%constant_int_0\t\t\t\t\t= OpConstant %type_int  0\n");
  poVar2 = std::operator<<(poVar2,"%constant_int_1\t\t\t\t\t= OpConstant %type_int  1\n");
  poVar2 = std::operator<<(poVar2,"%constant_int_2\t\t\t\t\t= OpConstant %type_int  2\n");
  poVar2 = std::operator<<(poVar2,"%constant_int_3\t\t\t\t\t= OpConstant %type_int  3\n");
  poVar2 = std::operator<<(poVar2,"%constant_float_0\t\t\t\t= OpConstant %type_float 0.0\n");
  poVar2 = std::operator<<(poVar2,"%constant_float_half\t\t\t= OpConstant %type_float 0.5\n");
  poVar2 = std::operator<<(poVar2,"%constant_texel_resident\t\t= OpConstant %type_uint ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%constant_texel_not_resident\t= OpConstant %type_uint ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%func_main\t\t = OpFunction %type_void None %type_void_func\n");
  poVar2 = std::operator<<(poVar2,"%label_func_main = OpLabel\n");
  poVar2 = std::operator<<(poVar2,
                           "%local_image_sparse = OpLoad %type_sampled_image_sparse %uniformconst_image_sparse\n"
                          );
  poVar2 = std::operator<<(poVar2,"%texCoord = OpLoad %type_vec3 %varying_texCoord\n");
  poVar2 = std::operator<<(poVar2,"%local_texCoord_x = OpCompositeExtract %type_float %texCoord 0\n"
                          );
  poVar2 = std::operator<<(poVar2,"%local_texCoord_y = OpCompositeExtract %type_float %texCoord 1\n"
                          );
  poVar2 = std::operator<<(poVar2,"%local_texCoord_z = OpCompositeExtract %type_float %texCoord 2\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_texCoord_xy\t= OpCompositeConstruct %type_vec2 %local_texCoord_x %local_texCoord_y\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_texCoord_xyz = OpCompositeConstruct %type_vec3 %local_texCoord_x %local_texCoord_y %local_texCoord_z\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%access_uniformblock_member_uint_lod = OpAccessChain %type_pushconstant_uniformblock_member_lod %uniformblock_instance %constant_int_0\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_uniformblock_member_uint_lod  = OpLoad %type_uint %access_uniformblock_member_uint_lod\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_uniformblock_member_float_lod = OpConvertUToF %type_float %local_uniformblock_member_uint_lod\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%access_uniformblock_member_size\t = OpAccessChain %type_pushconstant_uniformblock_member_size %uniformblock_instance %constant_int_1\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_uniformblock_member_size\t\t = OpLoad %type_vec2 %access_uniformblock_member_size\n"
                          );
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"%local_sparse_op_result",&local_441)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,"%type_struct_int_img_comp_vec4",&local_442);
  std::__cxx11::string::string<std::allocator<char>>(local_398,"%local_image_sparse",&local_443);
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"%local_uniformblock_member_float_lod",&local_444);
  (*(this->super_SparseShaderIntrinsicsCaseBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])(&local_3d8,this,local_3b8,local_378,local_398,&coordString,local_338);
  poVar2 = std::operator<<(poVar2,(string *)&local_3d8);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"%local_img_comp_vec4 = OpCompositeExtract ");
  poVar2 = std::operator<<(poVar2,(string *)&typeImgCompVec4);
  poVar2 = std::operator<<(poVar2," %local_sparse_op_result 1\n");
  poVar2 = std::operator<<(poVar2,"OpStore %output_texel %local_img_comp_vec4\n");
  poVar2 = std::operator<<(poVar2,
                           "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n"
                          );
  poVar2 = std::operator<<(poVar2,
                           "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
                          );
  poVar2 = std::operator<<(poVar2,"OpSelectionMerge %branch_texel_resident None\n");
  poVar2 = std::operator<<(poVar2,
                           "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
                          );
  poVar2 = std::operator<<(poVar2,"%label_texel_resident = OpLabel\n");
  poVar2 = std::operator<<(poVar2,"OpStore %output_residency %constant_texel_resident\n");
  poVar2 = std::operator<<(poVar2,"OpBranch %branch_texel_resident\n");
  poVar2 = std::operator<<(poVar2,"%label_texel_not_resident = OpLabel\n");
  poVar2 = std::operator<<(poVar2,"OpStore %output_residency %constant_texel_not_resident\n");
  poVar2 = std::operator<<(poVar2,"OpBranch %branch_texel_resident\n");
  poVar2 = std::operator<<(poVar2,"%branch_texel_resident = OpLabel\n");
  poVar2 = std::operator<<(poVar2,"OpReturn\n");
  std::operator<<(poVar2,"OpFunctionEnd\n");
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_3b8);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"fragment_shader",(allocator<char> *)local_3b8);
  src = ::vk::ProgramCollection<vk::SpirVAsmSource>::add
                  (&programCollection->spirvAsmSources,&local_420);
  std::__cxx11::stringbuf::str();
  ::vk::operator<<(src,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&typeImgCompVec4);
  std::__cxx11::string::~string((string *)&typeImgComp);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vs);
  std::__cxx11::string::~string((string *)&coordString);
  return;
}

Assistant:

void SparseShaderIntrinsicsCaseSampledBase::initPrograms (vk::SourceCollections& programCollection) const
{
	const deUint32		numLayers	= getNumLayers(m_imageType, m_imageSize);
	const std::string	coordString = getShaderImageCoordinates(m_imageType, "%local_texCoord_x", "%local_texCoord_xy", "%local_texCoord_xyz");

	// Create vertex shader
	std::ostringstream vs;

	vs	<< "#version 440\n"
		<< "layout(location = 0) in  highp vec2 vs_in_position;\n"
		<< "layout(location = 1) in  highp vec2 vs_in_texCoord;\n"
		<< "\n"
		<< "layout(location = 0) out highp vec3 vs_out_texCoord;\n"
		<< "\n"
		<< "out gl_PerVertex {\n"
		<< "	vec4  gl_Position;\n"
		<< "};\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position		= vec4(vs_in_position, 0.0f, 1.0f);\n"
		<< "	vs_out_texCoord = vec3(vs_in_texCoord, 0.0f);\n"
		<< "}\n";

	programCollection.glslSources.add("vertex_shader") << glu::VertexSource(vs.str());

	if (numLayers > 1u)
	{
		const deInt32 maxVertices = 3u * numLayers;

		// Create geometry shader
		std::ostringstream gs;

		gs << "#version 440\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = " << static_cast<deInt32>(maxVertices) << ") out;\n"
			<< "\n"
			<< "in gl_PerVertex {\n"
			<< "	vec4  gl_Position;\n"
			<< "} gl_in[];\n"
			<< "out gl_PerVertex {\n"
			<< "	vec4  gl_Position;\n"
			<< "};\n"
			<< "layout(location = 0) in  highp vec3 gs_in_texCoord[];\n"
			<< "\n"
			<< "layout(location = 0) out highp vec3 gs_out_texCoord;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    for (int layerNdx = 0; layerNdx < " << static_cast<deInt32>(numLayers) << "; ++layerNdx)\n"
			<< "    {\n"
			<< "		for (int vertexNdx = 0; vertexNdx < gl_in.length(); ++vertexNdx)\n"
			<< "		{\n"
			<< "			gl_Layer		= layerNdx;\n"
			<< "			gl_Position		= gl_in[vertexNdx].gl_Position;\n"
			<< "			gs_out_texCoord = vec3(gs_in_texCoord[vertexNdx].xy, float(layerNdx));\n"
			<< "			EmitVertex();\n"
			<< "		}\n"
			<< "		EndPrimitive();\n"
			<< "    }\n"
			<< "}\n";

		programCollection.glslSources.add("geometry_shader") << glu::GeometrySource(gs.str());
	}

	// Create fragment shader
	std::ostringstream fs;

	const std::string	typeImgComp		= getImageComponentTypeName(m_format);
	const std::string	typeImgCompVec4	= getImageComponentVec4TypeName(m_format);

	fs	<< "OpCapability Shader\n"
		<< "OpCapability SampledCubeArray\n"
		<< "OpCapability ImageCubeArray\n"
		<< "OpCapability SparseResidency\n"
		<< "OpCapability StorageImageExtendedFormats\n"

		<< "%ext_import = OpExtInstImport \"GLSL.std.450\"\n"
		<< "OpMemoryModel Logical GLSL450\n"
		<< "OpEntryPoint Fragment %func_main \"main\" %varying_texCoord %output_texel %output_residency\n"
		<< "OpExecutionMode %func_main OriginUpperLeft\n"
		<< "OpSource GLSL 440\n"

		<< "OpName %func_main \"main\"\n"

		<< "OpName %varying_texCoord \"varying_texCoord\"\n"

		<< "OpName %output_texel \"out_texel\"\n"
		<< "OpName %output_residency \"out_residency\"\n"

		<< "OpName %type_uniformblock \"LodBlock\"\n"
		<< "OpMemberName %type_uniformblock 0 \"lod\"\n"
		<< "OpMemberName %type_uniformblock 1 \"size\"\n"
		<< "OpName %uniformblock_instance \"lodInstance\"\n"

		<< "OpName %uniformconst_image_sparse \"u_imageSparse\"\n"

		<< "OpDecorate %varying_texCoord Location 0\n"

		<< "OpDecorate %output_texel	 Location 0\n"
		<< "OpDecorate %output_residency Location 1\n"

		<< "OpDecorate		 %type_uniformblock Block\n"
		<< "OpMemberDecorate %type_uniformblock 0 Offset 0\n"
		<< "OpMemberDecorate %type_uniformblock 1 Offset 8\n"

		<< "OpDecorate %uniformconst_image_sparse DescriptorSet 0\n"
		<< "OpDecorate %uniformconst_image_sparse Binding " << BINDING_IMAGE_SPARSE << "\n"

		<< "%type_void = OpTypeVoid\n"
		<< "%type_void_func = OpTypeFunction %type_void\n"

		<< "%type_bool							= OpTypeBool\n"
		<< "%type_int							= OpTypeInt 32 1\n"
		<< "%type_uint							= OpTypeInt 32 0\n"
		<< "%type_float							= OpTypeFloat 32\n"
		<< "%type_vec2							= OpTypeVector %type_float 2\n"
		<< "%type_vec3							= OpTypeVector %type_float 3\n"
		<< "%type_vec4							= OpTypeVector %type_float 4\n"
		<< "%type_ivec4						= OpTypeVector %type_int  4\n"
		<< "%type_uvec4						= OpTypeVector %type_uint 4\n"
		<< "%type_uniformblock					= OpTypeStruct %type_uint %type_vec2\n"
		<< "%type_struct_int_img_comp_vec4	= OpTypeStruct %type_int " << typeImgCompVec4 << "\n"

		<< "%type_input_vec3					= OpTypePointer Input %type_vec3\n"
		<< "%type_input_float					= OpTypePointer Input %type_float\n"

		<< "%type_output_img_comp_vec4			= OpTypePointer Output " << typeImgCompVec4 << "\n"
		<< "%type_output_uint					= OpTypePointer Output %type_uint\n"

		<< "%type_function_int					= OpTypePointer Function %type_int\n"
		<< "%type_function_img_comp_vec4		= OpTypePointer Function " << typeImgCompVec4 << "\n"
		<< "%type_function_int_img_comp_vec4	= OpTypePointer Function %type_struct_int_img_comp_vec4\n"

		<< "%type_pushconstant_uniformblock				= OpTypePointer PushConstant %type_uniformblock\n"
		<< "%type_pushconstant_uniformblock_member_lod  = OpTypePointer PushConstant %type_uint\n"
		<< "%type_pushconstant_uniformblock_member_size = OpTypePointer PushConstant %type_vec2\n"

		<< "%type_image_sparse				= " << getOpTypeImageSparse(m_imageType, m_format, typeImgComp, true) << "\n"
		<< "%type_sampled_image_sparse		= OpTypeSampledImage %type_image_sparse\n"
		<< "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_sampled_image_sparse\n"

		<< "%varying_texCoord			= OpVariable %type_input_vec3 Input\n"

		<< "%output_texel				= OpVariable %type_output_img_comp_vec4 Output\n"
		<< "%output_residency			= OpVariable %type_output_uint Output\n"

		<< "%uniformconst_image_sparse	= OpVariable %type_uniformconst_image_sparse UniformConstant\n"

		<< "%uniformblock_instance  = OpVariable %type_pushconstant_uniformblock PushConstant\n"

		// Declare constants
		<< "%constant_uint_0				= OpConstant %type_uint 0\n"
		<< "%constant_uint_1				= OpConstant %type_uint 1\n"
		<< "%constant_uint_2				= OpConstant %type_uint 2\n"
		<< "%constant_uint_3				= OpConstant %type_uint 3\n"
		<< "%constant_int_0					= OpConstant %type_int  0\n"
		<< "%constant_int_1					= OpConstant %type_int  1\n"
		<< "%constant_int_2					= OpConstant %type_int  2\n"
		<< "%constant_int_3					= OpConstant %type_int  3\n"
		<< "%constant_float_0				= OpConstant %type_float 0.0\n"
		<< "%constant_float_half			= OpConstant %type_float 0.5\n"
		<< "%constant_texel_resident		= OpConstant %type_uint " << MEMORY_BLOCK_BOUND_VALUE << "\n"
		<< "%constant_texel_not_resident	= OpConstant %type_uint " << MEMORY_BLOCK_NOT_BOUND_VALUE << "\n"

		// Call main function
		<< "%func_main		 = OpFunction %type_void None %type_void_func\n"
		<< "%label_func_main = OpLabel\n"

		<< "%local_image_sparse = OpLoad %type_sampled_image_sparse %uniformconst_image_sparse\n"

		<< "%texCoord = OpLoad %type_vec3 %varying_texCoord\n"

		<< "%local_texCoord_x = OpCompositeExtract %type_float %texCoord 0\n"
		<< "%local_texCoord_y = OpCompositeExtract %type_float %texCoord 1\n"
		<< "%local_texCoord_z = OpCompositeExtract %type_float %texCoord 2\n"

		<< "%local_texCoord_xy	= OpCompositeConstruct %type_vec2 %local_texCoord_x %local_texCoord_y\n"
		<< "%local_texCoord_xyz = OpCompositeConstruct %type_vec3 %local_texCoord_x %local_texCoord_y %local_texCoord_z\n"

		<< "%access_uniformblock_member_uint_lod = OpAccessChain %type_pushconstant_uniformblock_member_lod %uniformblock_instance %constant_int_0\n"
		<< "%local_uniformblock_member_uint_lod  = OpLoad %type_uint %access_uniformblock_member_uint_lod\n"
		<< "%local_uniformblock_member_float_lod = OpConvertUToF %type_float %local_uniformblock_member_uint_lod\n"
		<< "%access_uniformblock_member_size	 = OpAccessChain %type_pushconstant_uniformblock_member_size %uniformblock_instance %constant_int_1\n"
		<< "%local_uniformblock_member_size		 = OpLoad %type_vec2 %access_uniformblock_member_size\n"

		<< sparseImageOpString("%local_sparse_op_result", "%type_struct_int_img_comp_vec4", "%local_image_sparse", coordString, "%local_uniformblock_member_float_lod") << "\n"

		// Load texel value
		<< "%local_img_comp_vec4 = OpCompositeExtract " << typeImgCompVec4 << " %local_sparse_op_result 1\n"

		<< "OpStore %output_texel %local_img_comp_vec4\n"

		// Load residency code
		<< "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n"

		// Check if loaded texel is placed in resident memory
		<< "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
		<< "OpSelectionMerge %branch_texel_resident None\n"
		<< "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
		<< "%label_texel_resident = OpLabel\n"

		// Loaded texel is in resident memory
		<< "OpStore %output_residency %constant_texel_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%label_texel_not_resident = OpLabel\n"

		// Loaded texel is not in resident memory
		<< "OpStore %output_residency %constant_texel_not_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%branch_texel_resident = OpLabel\n"

		<< "OpReturn\n"
		<< "OpFunctionEnd\n";

	programCollection.spirvAsmSources.add("fragment_shader") << fs.str();
}